

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddPubkeyHashSign
              (void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,
              char *pubkey,char *signature,bool use_der_encode,int sighash_type,
              bool sighash_anyone_can_pay,char **tx_string)

{
  bool bVar1;
  undefined1 der_encode;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  uint32_t in_R8D;
  OutPoint *in_stack_00000008;
  char *in_stack_00000010;
  byte in_stack_00000018;
  uint8_t in_stack_00000020;
  byte in_stack_00000028;
  undefined8 *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  OutPoint outpoint;
  bool is_bitcoin;
  ByteData signature_bytes;
  SigHashType sighashtype;
  SignParameter param;
  AddressType addr_type;
  string *in_stack_fffffffffffff858;
  ConfidentialTransactionContext *in_stack_fffffffffffff860;
  string *in_stack_fffffffffffff870;
  undefined8 in_stack_fffffffffffff878;
  CfdError error_code;
  allocator *paVar4;
  SignParameter *in_stack_fffffffffffff880;
  AddressType AVar5;
  SigHashType *in_stack_fffffffffffff888;
  allocator *paVar6;
  SignParameter *in_stack_fffffffffffff890;
  OutPoint *in_stack_fffffffffffff898;
  ConfidentialTransactionContext *in_stack_fffffffffffff8a0;
  TransactionContext *this;
  bool *in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c0;
  int hash_type_00;
  string *message;
  SignParameter *in_stack_fffffffffffff8f8;
  SignParameter *in_stack_fffffffffffff900;
  SigHashType *in_stack_fffffffffffff938;
  string *in_stack_fffffffffffff948;
  SignParameter *in_stack_fffffffffffff950;
  string local_678;
  allocator local_651;
  string local_650;
  Pubkey local_630;
  allocator local_611;
  string local_610 [32];
  AbstractTransaction local_5f0 [11];
  string local_538;
  undefined1 local_511 [288];
  string local_3f1;
  Txid local_3d0;
  OutPoint local_3b0;
  byte local_381;
  SigHashType local_380;
  allocator local_371;
  string local_370 [156];
  SigHashType local_2d4 [11];
  allocator local_249;
  string local_248;
  ByteData local_228;
  SigHashType local_20c [11];
  AddressType local_188;
  undefined1 local_182;
  allocator local_181;
  string local_180 [32];
  CfdSourceLocation local_160;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  CfdSourceLocation local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  byte local_32;
  byte local_31;
  uint32_t local_2c;
  char *local_28;
  char *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff878 >> 0x20);
  hash_type_00 = (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20);
  local_31 = in_stack_00000018 & 1;
  local_32 = in_stack_00000028 & 1;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x668;
    local_60.funcname = "CfdAddPubkeyHashSign";
    cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
    local_82 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar6 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",paVar6);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff880,error_code,in_stack_fffffffffffff870);
    local_82 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  der_encode = cfd::capi::IsEmptyString(local_28);
  if ((bool)der_encode) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x66e;
    local_a0.funcname = "CfdAddPubkeyHashSign";
    cfd::core::logger::warn<>(&local_a0,"txid is null or empty.");
    local_c2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar6 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Failed to parameter. txid is null or empty.",paVar6);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff880,error_code,in_stack_fffffffffffff870);
    local_c2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString((char *)in_stack_00000008);
  if (bVar1) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x674;
    local_e0.funcname = "CfdAddPubkeyHashSign";
    cfd::core::logger::warn<>(&local_e0,"pubkey is null or empty.");
    local_102 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Failed to parameter. pubkey is null or empty.",&local_101);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff880,error_code,in_stack_fffffffffffff870);
    local_102 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(in_stack_00000010);
  if (!bVar1) {
    if (in_stack_00000030 == (undefined8 *)0x0) {
      local_160.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_160.filename = local_160.filename + 1;
      local_160.line = 0x680;
      local_160.funcname = "CfdAddPubkeyHashSign";
      cfd::core::logger::warn<>(&local_160,"tx output is null.");
      local_182 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      paVar6 = &local_181;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"Failed to parameter. tx output is null.",paVar6);
      cfd::core::CfdException::CfdException
                ((CfdException *)in_stack_fffffffffffff880,error_code,in_stack_fffffffffffff870);
      local_182 = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_188 = cfd::capi::ConvertHashToAddressType(hash_type_00);
    cfd::SignParameter::SignParameter(in_stack_fffffffffffff880);
    AVar5 = (AddressType)((ulong)in_stack_fffffffffffff880 >> 0x20);
    if ((local_31 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_370,in_stack_00000010,&local_371);
      cfd::core::SigHashType::SigHashType(&local_380,kSigHashAll,false,false);
      cfd::SignParameter::SignParameter
                (in_stack_fffffffffffff950,in_stack_fffffffffffff948,(bool)der_encode,
                 in_stack_fffffffffffff938);
      cfd::SignParameter::operator=(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffff860);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
    }
    else {
      cfd::core::SigHashType::Create(local_20c,in_stack_00000020,(bool)(local_32 & 1),false);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_248,in_stack_00000010,&local_249);
      cfd::core::ByteData::ByteData(&local_228,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      cfd::core::SigHashType::SigHashType(local_2d4,local_20c);
      cfd::SignParameter::SignParameter
                ((SignParameter *)in_stack_fffffffffffff8a0,(ByteData *)in_stack_fffffffffffff898,
                 SUB81((ulong)in_stack_fffffffffffff890 >> 0x38,0),in_stack_fffffffffffff888);
      cfd::SignParameter::operator=(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffff860);
      cfd::core::ByteData::~ByteData((ByteData *)0x616743);
    }
    local_381 = 0;
    cfd::capi::ConvertNetType(hash_type_00,in_stack_fffffffffffff8b8);
    message = &local_3f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f1.field_0x1,local_28,(allocator *)message);
    cfd::core::Txid::Txid(&local_3d0,(string *)&local_3f1.field_0x1);
    cfd::core::OutPoint::OutPoint(&local_3b0,&local_3d0,local_2c);
    cfd::core::Txid::~Txid((Txid *)0x6169a8);
    std::__cxx11::string::~string((string *)&local_3f1.field_0x1);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    if ((local_381 & 1) == 0) {
      paVar6 = &local_611;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_610,local_20,paVar6);
      AVar5 = (AddressType)((ulong)local_20 >> 0x20);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
      std::__cxx11::string::~string(local_610);
      std::allocator<char>::~allocator((allocator<char> *)&local_611);
      paVar4 = &local_651;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_650,(char *)in_stack_00000008,paVar4);
      cfd::core::Pubkey::Pubkey(&local_630,&local_650);
      cfd::ConfidentialTransactionContext::AddPubkeyHashSign
                (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                 (Pubkey *)paVar6,AVar5);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x616d93);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator((allocator<char> *)&local_651);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_678,local_5f0);
      pcVar3 = cfd::capi::CreateString(message);
      *in_stack_00000030 = pcVar3;
      std::__cxx11::string::~string((string *)&local_678);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                (in_stack_fffffffffffff860);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)local_511 + 0x41),local_20,(allocator *)((long)local_511 + 0x40));
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
      std::__cxx11::string::~string((string *)((long)local_511 + 0x41));
      std::allocator<char>::~allocator((allocator<char> *)((long)local_511 + 0x40));
      this = (TransactionContext *)local_511;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)local_511 + 1),(char *)in_stack_00000008,(allocator *)this);
      cfd::core::Pubkey::Pubkey((Pubkey *)((long)local_511 + 0x21),(string *)((long)local_511 + 1));
      cfd::TransactionContext::AddPubkeyHashSign
                (this,in_stack_00000008,in_stack_fffffffffffff890,
                 (Pubkey *)in_stack_fffffffffffff888,AVar5);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x616ac4);
      std::__cxx11::string::~string((string *)((long)local_511 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_511);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                (&local_538,(AbstractTransaction *)(local_511 + 0x61));
      pcVar3 = cfd::capi::CreateString(message);
      *in_stack_00000030 = pcVar3;
      std::__cxx11::string::~string((string *)&local_538);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffff860);
    }
    local_4 = 0;
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x616f17);
    cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffff860);
    return local_4;
  }
  local_120.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_120.filename = local_120.filename + 1;
  local_120.line = 0x67a;
  local_120.funcname = "CfdAddPubkeyHashSign";
  cfd::core::logger::warn<>(&local_120,"signature is null or empty.");
  local_142 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,"Failed to parameter. signature is null or empty.",&local_141);
  cfd::core::CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffff880,error_code,in_stack_fffffffffffff870);
  local_142 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddPubkeyHashSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey, const char* signature,
    bool use_der_encode, int sighash_type, bool sighash_anyone_can_pay,
    char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(signature));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(signature));
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}